

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<kj::Own<kj::NetworkAddress>_> __thiscall
kj::anon_unknown_0::ConnectionCountingNetwork::parseAddress
          (ConnectionCountingNetwork *this,StringPtr addr,uint portHint)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar2;
  _func_int **pp_Var3;
  Promise<kj::Own<kj::NetworkAddress>_> PVar4;
  Own<kj::_::PromiseNode> local_28;
  
  pp_Var3 = (_func_int **)addr.content.ptr;
  *(int *)pp_Var3[3] = *(int *)pp_Var3[3] + 1;
  (*(code *)**(undefined8 **)pp_Var3[1])(&local_28,pp_Var3[1],addr.content.size_);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_28,
             _::
             TransformPromiseNode<kj::Own<kj::NetworkAddress>,_kj::Own<kj::NetworkAddress>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:2843:15),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  pPVar1 = local_28.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00440d28;
  this_00[1].super_PromiseNode._vptr_PromiseNode = pp_Var3;
  (this->super_Network)._vptr_Network =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::NetworkAddress>,kj::Own<kj::NetworkAddress>,kj::(anonymous_namespace)::ConnectionCountingNetwork::parseAddress(kj::StringPtr,unsigned_int)::{lambda(kj::Own<kj::NetworkAddress>&&)#1},kj::_::PropagateException>>
        ::instance;
  this->inner = (Network *)this_00;
  pPVar2 = extraout_RDX;
  if (local_28.ptr != (PromiseNode *)0x0) {
    local_28.ptr = (PromiseNode *)0x0;
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pPVar2 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar2;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<kj::NetworkAddress>_>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint = 0) override {
    ++addrCount;
    return inner.parseAddress(addr, portHint)
        .then([this](Own<NetworkAddress>&& addr) -> Own<NetworkAddress> {
      return kj::heap<CountingNetworkAddress>(kj::mv(addr), count, addrCount);
    });
  }